

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O3

void __thiscall
o3dgc::BinaryStream::WriteUInt32ASCII(BinaryStream *this,unsigned_long position,unsigned_long value)

{
  unsigned_long i;
  long lVar1;
  
  if (position < (this->m_stream).m_size - 5) {
    lVar1 = 0;
    do {
      (this->m_stream).m_buffer[lVar1 + position] = (byte)value & 0x7f;
      value = value >> 7;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    return;
  }
  __assert_fail("position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0x10f,"void o3dgc::BinaryStream::WriteUInt32ASCII(unsigned long, unsigned long)");
}

Assistant:

void                    WriteUInt32ASCII(unsigned long position, unsigned long value) 
                                {
                                    assert(position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32);
                                    unsigned long value0 = value;
                                    for(unsigned long i = 0; i < O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32; ++i)
                                    {
                                        m_stream[position++] = (value0 & O3DGC_BINARY_STREAM_MAX_SYMBOL0);
                                        value0 >>= O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0;
                                    }
                                }